

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O2

bool __thiscall
burst::
subset_iterator<boost::range_detail::integer_iterator<int>,_std::less<void>,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
::equal(subset_iterator<boost::range_detail::integer_iterator<int>,_std::less<void>,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
        *this,subset_iterator<boost::range_detail::integer_iterator<int>,_std::less<void>,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
              *that)

{
  __normal_iterator<const_boost::range_detail::integer_iterator<int>_*,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
  __first1;
  __normal_iterator<const_boost::range_detail::integer_iterator<int>_*,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
  __first2;
  bool bVar1;
  
  if ((this->m_begin).m_value != (that->m_begin).m_value) {
    __assert_fail("this->m_begin == that.m_begin",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subset_iterator.hpp"
                  ,0x81,
                  "bool burst::subset_iterator<boost::range_detail::integer_iterator<int>>::equal(const subset_iterator<ForwardIterator, Compare, SubsetContainer> &) const [ForwardIterator = boost::range_detail::integer_iterator<int>, Compare = std::less<void>, SubsetContainer = std::vector<boost::range_detail::integer_iterator<int>>]"
                 );
  }
  if ((this->m_end).m_value == (that->m_end).m_value) {
    __first1._M_current =
         (this->m_subset).
         super__Vector_base<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __first2._M_current =
         (that->m_subset).
         super__Vector_base<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    bVar1 = std::
            __equal4<__gnu_cxx::__normal_iterator<boost::range_detail::integer_iterator<int>const*,std::vector<boost::range_detail::integer_iterator<int>,std::allocator<boost::range_detail::integer_iterator<int>>>>,__gnu_cxx::__normal_iterator<boost::range_detail::integer_iterator<int>const*,std::vector<boost::range_detail::integer_iterator<int>,std::allocator<boost::range_detail::integer_iterator<int>>>>>
                      (__first1,__first1._M_current + this->m_subset_size,__first2,
                       __first2._M_current + that->m_subset_size);
    return bVar1;
  }
  __assert_fail("this->m_end == that.m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subset_iterator.hpp"
                ,0x82,
                "bool burst::subset_iterator<boost::range_detail::integer_iterator<int>>::equal(const subset_iterator<ForwardIterator, Compare, SubsetContainer> &) const [ForwardIterator = boost::range_detail::integer_iterator<int>, Compare = std::less<void>, SubsetContainer = std::vector<boost::range_detail::integer_iterator<int>>]"
               );
}

Assistant:

bool equal (const subset_iterator & that) const
        {
            BOOST_ASSERT(this->m_begin == that.m_begin);
            BOOST_ASSERT(this->m_end == that.m_end);
            return
                std::equal
                (
                    this->subset_begin(), this->subset_end(),
                    that.subset_begin(), that.subset_end()
                );
        }